

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  StatsAccumulator *in_stack_ffffffffffffffe8;
  anon_class_1_0_00000001 *in_stack_fffffffffffffff0;
  
  operator()(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

BilinearPatchMesh::BilinearPatchMesh(const Transform &renderFromObject,
                                     bool reverseOrientation, std::vector<int> indices,
                                     std::vector<Point3f> P, std::vector<Normal3f> N,
                                     std::vector<Point2f> UV, std::vector<int> fIndices,
                                     PiecewiseConstant2D *imageDist, Allocator alloc)
    : reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject.SwapsHandedness()),
      nPatches(indices.size() / 4),
      nVertices(P.size()),
      imageDistribution(imageDist) {
    CHECK_EQ((indices.size() % 4), 0);
    ++nBilinearMeshes;
    nBlps += nPatches;

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(P.size(), std::numeric_limits<int>::max());
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());

    vertexIndices = intBufferCache->LookupOrAdd(indices, alloc);

    blpBytes += sizeof(*this);

    // Transform mesh vertices to rendering space
    for (Point3f &p : P)
        p = renderFromObject(p);
    p = point3BufferCache->LookupOrAdd(P, alloc);

    // Copy _UV_ and _N_ vertex data, if present
    if (!UV.empty()) {
        CHECK_EQ(nVertices, UV.size());
        uv = point2BufferCache->LookupOrAdd(UV, alloc);
    }
    if (!N.empty()) {
        CHECK_EQ(nVertices, N.size());
        for (Normal3f &n : N) {
            n = renderFromObject(n);
            if (reverseOrientation)
                n = -n;
        }
        n = normal3BufferCache->LookupOrAdd(N, alloc);
    }

    if (!fIndices.empty()) {
        CHECK_EQ(nPatches, fIndices.size());
        faceIndices = intBufferCache->LookupOrAdd(fIndices, alloc);
    }
}